

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MessageSetFieldSkipper::SkipMessageSetField
          (MessageSetFieldSkipper *this,CodedInputStream *input,int field_number)

{
  UnknownFieldSet *this_00;
  bool bVar1;
  string *buffer;
  uint32 length;
  uint32 local_1c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_1c);
  if (bVar1) {
    this_00 = (this->super_UnknownFieldSetFieldSkipper).unknown_fields_;
    if (this_00 == (UnknownFieldSet *)0x0) {
      bVar1 = io::CodedInputStream::Skip(input,local_1c);
    }
    else {
      buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_00,field_number);
      bVar1 = io::CodedInputStream::ReadString(input,buffer,local_1c);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MessageSetFieldSkipper::SkipMessageSetField(
    io::CodedInputStream* input, int field_number) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (unknown_fields_ == NULL) {
    return input->Skip(length);
  } else {
    return input->ReadString(
        unknown_fields_->AddLengthDelimited(field_number), length);
  }
}